

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool ON_BinaryArchive::ArchiveContains3dmTable
               (ON_3dmArchiveTableType table,uint archive_3dm_version,uint opennurbs_library_version
               )

{
  bool bVar1;
  bool bVar2;
  
  if (archive_3dm_version != 0) {
    if (5 < archive_3dm_version) {
      if (archive_3dm_version < 0x32) {
        return false;
      }
      if (archive_3dm_version % 10 != 0) {
        return false;
      }
    }
    if (archive_3dm_version < 3 || opennurbs_library_version != 0) {
      switch(table) {
      case start_section:
      case properties_table:
      case settings_table:
        return true;
      case properties_table|start_section:
      case settings_table|start_section:
      case settings_table|properties_table:
      case settings_table|properties_table|start_section:
        return false;
      case bitmap_table:
        return archive_3dm_version != 1;
      }
      if (table == texture_mapping_table) {
        bVar1 = 3 < archive_3dm_version;
        bVar2 = opennurbs_library_version < 0xbf38e86;
      }
      else {
        if (table == material_table) {
          return true;
        }
        if (table == linetype_table) {
          bVar1 = 3 < archive_3dm_version;
          bVar2 = opennurbs_library_version < 0xbf36f82;
        }
        else {
          if (table == layer_table) {
            return true;
          }
          if (table == group_table) {
            bVar1 = archive_3dm_version != 1;
            bVar2 = opennurbs_library_version < 0xbebf1b2;
          }
          else if (table == text_style_table) {
            bVar1 = 2 < archive_3dm_version;
            bVar2 = opennurbs_library_version < 0xbed6c7c;
          }
          else if (table == dimension_style_table) {
            bVar1 = 2 < archive_3dm_version;
            bVar2 = opennurbs_library_version < 0xbed6ccc;
          }
          else {
            if (table == light_table) {
              return true;
            }
            if (table == hatchpattern_table) {
              bVar1 = 3 < archive_3dm_version;
              bVar2 = opennurbs_library_version < 0xbf1f026;
            }
            else if (table == instance_definition_table) {
              bVar1 = 2 < archive_3dm_version;
              bVar2 = opennurbs_library_version < 0xbeee336;
            }
            else {
              if (table == object_table) {
                return true;
              }
              if (table != historyrecord_table) {
                if (table == user_table) {
                  return 3 < archive_3dm_version;
                }
                if (table == end_mark) {
                  return true;
                }
                return false;
              }
              bVar1 = 3 < archive_3dm_version;
              bVar2 = opennurbs_library_version < 0xbf4ee5c;
            }
          }
        }
      }
      return (bool)(!bVar2 & bVar1);
    }
  }
  return false;
}

Assistant:

bool ON_BinaryArchive::ArchiveContains3dmTable(
  ON_3dmArchiveTableType table,
  unsigned int archive_3dm_version,
  unsigned int opennurbs_library_version
  )
{
  if ( archive_3dm_version <= 0 )
    return false;
  if (archive_3dm_version > 5)
  {
    if (archive_3dm_version < 50)
      return false;
    if (0 != archive_3dm_version % 10)
      return false;
  }
  if ( archive_3dm_version >= 3 && opennurbs_library_version <= 0 )
    return false;

  bool rc;
  switch (table)
  {
  case ON_3dmArchiveTableType::Unset:
    rc = false;
    break;
  case ON_3dmArchiveTableType::start_section:
    rc = true;
    break;
  case ON_3dmArchiveTableType::properties_table:
    rc = true;
    break;
  case ON_3dmArchiveTableType::settings_table:
    rc = true;
    break;
  case ON_3dmArchiveTableType::bitmap_table:
    rc = (archive_3dm_version >= 2);
    break;
  case ON_3dmArchiveTableType::texture_mapping_table:
    rc = (archive_3dm_version >= 4 && opennurbs_library_version >= 200511110);
    break;
  case ON_3dmArchiveTableType::material_table:
    rc = true;
    break;
  case ON_3dmArchiveTableType::linetype_table:
    rc = (archive_3dm_version >= 4 && opennurbs_library_version >= 200503170 );
    break;
  case ON_3dmArchiveTableType::layer_table:
    rc = true;
    break;
  case ON_3dmArchiveTableType::group_table:
    rc = (archive_3dm_version >= 2 && opennurbs_library_version >= 200012210);
    break;
  case ON_3dmArchiveTableType::text_style_table:
    rc =  (archive_3dm_version >= 3 && opennurbs_library_version >= 200109180);
    break;
  case ON_3dmArchiveTableType::dimension_style_table:
    rc =  (archive_3dm_version >= 3 && opennurbs_library_version >= 200109260);
    break;
  case ON_3dmArchiveTableType::light_table:
    rc = true;
    break;
  case ON_3dmArchiveTableType::hatchpattern_table:
    rc = (archive_3dm_version >= 4 && opennurbs_library_version >= 200405030);
    break;
  case ON_3dmArchiveTableType::instance_definition_table:
    rc = (archive_3dm_version >= 3 && opennurbs_library_version >= 200205110);
    break;
  case ON_3dmArchiveTableType::object_table:
    rc = true;
    break;
  case ON_3dmArchiveTableType::historyrecord_table:
    rc = ( archive_3dm_version >= 4 && opennurbs_library_version >= 200601180 );
    break;
  case ON_3dmArchiveTableType::user_table:
    rc = ( archive_3dm_version >= 4);
    break;
  case ON_3dmArchiveTableType::end_mark:
    rc = true;
    break;
  default:
    rc = false;
    break;
  }

  return rc;
}